

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  bool bVar1;
  ImGuiTabItemFlags IVar2;
  ImGuiID IVar3;
  ImGuiTabItemFlags IVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  int iVar8;
  ImGuiTabItem *pIVar9;
  ImGuiTabItem *pIVar10;
  ImVector<ImGuiTabBarSortItem> *this;
  ImGuiTabBarSortItem *pIVar11;
  ImVector<ImGuiTabItem> *in_RDI;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float scrolling_speed;
  ImGuiTabItem *scroll_track_selected_tab;
  ImGuiTabItem *tab_to_select;
  bool scrolling_buttons;
  ImGuiTabItem *tab_3;
  int tab_n_4;
  float offset_x;
  ImGuiTabItem *tab_2;
  int tab_n_3;
  float tab_max_width;
  int tab_n_2;
  int tab_n_1;
  float width_to_remove_per_tab;
  float width_to_remove_per_tab_max;
  int tab_count_same_width;
  float width_excess;
  float width_avail;
  ImGuiTabItem *tab_1;
  int tab_n;
  bool found_selected_tab_id;
  ImGuiTabItem *most_recently_selected_tab;
  float width_total_contents;
  ImVector<ImGuiTabBarSortItem> *width_sort_buffer;
  ImGuiTabItem item_tmp;
  ImGuiTabItem *tab2;
  int tab2_order;
  ImGuiTabItem *tab1;
  ImGuiID scroll_track_selected_tab_id;
  ImGuiTabItem *tab;
  int tab_src_n;
  int tab_dst_n;
  ImGuiContext *g;
  float in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  float in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  float local_10c;
  float in_stack_fffffffffffffef8;
  undefined2 in_stack_fffffffffffffefc;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  int in_stack_ffffffffffffff04;
  float local_f4;
  int local_c0;
  float local_bc;
  int local_ac;
  int local_a4;
  int local_a0;
  int local_94;
  float local_90;
  int local_80;
  ImGuiTabItem *local_78;
  float local_6c;
  ImGuiID local_24;
  int local_18;
  int local_14;
  ImGuiContext *pIVar16;
  ImGuiContext *tab_bar_00;
  
  pIVar16 = GImGui;
  *(undefined1 *)&in_RDI[5].Data = 0;
  local_14 = 0;
  for (local_18 = 0; local_18 < in_RDI->Size; local_18 = local_18 + 1) {
    pIVar9 = ImVector<ImGuiTabItem>::operator[](in_RDI,local_18);
    if (pIVar9->LastFrameVisible < in_RDI[2].Capacity) {
      if (pIVar9->ID == in_RDI[1].Capacity) {
        in_RDI[1].Capacity = 0;
      }
    }
    else {
      if (local_14 != local_18) {
        pIVar9 = ImVector<ImGuiTabItem>::operator[](in_RDI,local_18);
        pIVar10 = ImVector<ImGuiTabItem>::operator[](in_RDI,local_14);
        IVar2 = pIVar9->Flags;
        pIVar10->ID = pIVar9->ID;
        pIVar10->Flags = IVar2;
        iVar8 = pIVar9->LastFrameSelected;
        pIVar10->LastFrameVisible = pIVar9->LastFrameVisible;
        pIVar10->LastFrameSelected = iVar8;
        fVar15 = pIVar9->Width;
        pIVar10->Offset = pIVar9->Offset;
        pIVar10->Width = fVar15;
        pIVar10->WidthContents = pIVar9->WidthContents;
      }
      local_14 = local_14 + 1;
    }
  }
  if (in_RDI->Size != local_14) {
    ImVector<ImGuiTabItem>::resize
              ((ImVector<ImGuiTabItem> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (int)in_stack_fffffffffffffecc);
  }
  local_24 = 0;
  if (*(int *)&in_RDI[1].Data != 0) {
    in_RDI[1].Capacity = *(int *)&in_RDI[1].Data;
    *(undefined4 *)&in_RDI[1].Data = 0;
    local_24 = in_RDI[1].Capacity;
  }
  if (in_RDI[5].Size != 0) {
    pIVar9 = TabBarFindTabByID((ImGuiTabBar *)
                               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),0);
    if (pIVar9 != (ImGuiTabItem *)0x0) {
      iVar8 = ImGuiTabBar::GetTabOrder
                        ((ImGuiTabBar *)
                         CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         (ImGuiTabItem *)
                         CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      iVar8 = iVar8 + in_RDI[5].Capacity;
      if ((-1 < iVar8) && (iVar8 < in_RDI->Size)) {
        pIVar10 = ImVector<ImGuiTabItem>::operator[](in_RDI,iVar8);
        IVar3 = pIVar9->ID;
        IVar4 = pIVar9->Flags;
        iVar5 = pIVar9->LastFrameVisible;
        iVar6 = pIVar9->LastFrameSelected;
        fVar14 = pIVar9->Offset;
        fVar7 = pIVar9->Width;
        fVar15 = pIVar9->WidthContents;
        IVar2 = pIVar10->Flags;
        pIVar9->ID = pIVar10->ID;
        pIVar9->Flags = IVar2;
        iVar8 = pIVar10->LastFrameSelected;
        pIVar9->LastFrameVisible = pIVar10->LastFrameVisible;
        pIVar9->LastFrameSelected = iVar8;
        fVar13 = pIVar10->Width;
        pIVar9->Offset = pIVar10->Offset;
        pIVar9->Width = fVar13;
        pIVar9->WidthContents = pIVar10->WidthContents;
        pIVar10->ID = IVar3;
        pIVar10->Flags = IVar4;
        pIVar10->LastFrameVisible = iVar5;
        pIVar10->LastFrameSelected = iVar6;
        pIVar10->Offset = fVar14;
        pIVar10->Width = fVar7;
        pIVar10->WidthContents = fVar15;
        if (pIVar10->ID == in_RDI[1].Capacity) {
          local_24 = pIVar10->ID;
        }
      }
      if (((ulong)in_RDI[4].Data & 0x80000000000000) != 0) {
        MarkIniSettingsDirty();
      }
    }
    in_RDI[5].Size = 0;
  }
  this = &pIVar16->TabSortByWidthBuffer;
  tab_bar_00 = pIVar16;
  ImVector<ImGuiTabBarSortItem>::resize
            ((ImVector<ImGuiTabBarSortItem> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (int)in_stack_fffffffffffffecc);
  local_6c = 0.0;
  local_78 = (ImGuiTabItem *)0x0;
  bVar1 = false;
  for (local_80 = 0; local_80 < in_RDI->Size; local_80 = local_80 + 1) {
    pIVar9 = ImVector<ImGuiTabItem>::operator[](in_RDI,local_80);
    if ((local_78 == (ImGuiTabItem *)0x0) ||
       (local_78->LastFrameSelected < pIVar9->LastFrameSelected)) {
      local_78 = pIVar9;
    }
    if (pIVar9->ID == in_RDI[1].Capacity) {
      bVar1 = true;
    }
    if (local_80 < 1) {
      local_f4 = 0.0;
    }
    else {
      local_f4 = (tab_bar_00->Style).ItemInnerSpacing.x;
    }
    local_6c = local_f4 + pIVar9->WidthContents + local_6c;
    in_stack_ffffffffffffff04 = local_80;
    pIVar11 = ImVector<ImGuiTabBarSortItem>::operator[](this,local_80);
    pIVar11->Index = in_stack_ffffffffffffff04;
    fVar15 = pIVar9->WidthContents;
    pIVar11 = ImVector<ImGuiTabBarSortItem>::operator[](this,local_80);
    pIVar11->Width = fVar15;
  }
  local_90 = ImRect::GetWidth((ImRect *)&in_RDI[2].Data);
  if (local_6c <= local_90) {
    local_90 = 0.0;
  }
  else {
    local_90 = local_6c - local_90;
  }
  if ((local_90 <= 0.0) || (((ulong)in_RDI[4].Data & 0x4000000000) == 0)) {
    fVar13 = TabBarCalcMaxTabWidth();
    fVar15 = local_90;
    for (local_ac = 0; local_ac < in_RDI->Size; local_ac = local_ac + 1) {
      pIVar9 = ImVector<ImGuiTabItem>::operator[](in_RDI,local_ac);
      fVar14 = ImMin<float>(pIVar9->WidthContents,fVar13);
      pIVar9->Width = fVar14;
    }
  }
  else {
    fVar15 = local_90;
    if (1 < in_RDI->Size) {
      qsort((pIVar16->TabSortByWidthBuffer).Data,(long)this->Size,8,TabBarSortItemComparer);
    }
    local_94 = 1;
    while( true ) {
      bVar12 = false;
      if (0.0 < local_90) {
        bVar12 = local_94 < in_RDI->Size;
      }
      if (!bVar12) break;
      while( true ) {
        in_stack_fffffffffffffefe = false;
        if (local_94 < in_RDI->Size) {
          pIVar11 = ImVector<ImGuiTabBarSortItem>::operator[](this,0);
          in_stack_fffffffffffffef8 = pIVar11->Width;
          pIVar11 = ImVector<ImGuiTabBarSortItem>::operator[](this,local_94);
          in_stack_fffffffffffffefe = in_stack_fffffffffffffef8 == pIVar11->Width;
        }
        if ((bool)in_stack_fffffffffffffefe == false) break;
        local_94 = local_94 + 1;
      }
      if (local_94 < in_RDI->Size) {
        pIVar11 = ImVector<ImGuiTabBarSortItem>::operator[](this,0);
        local_10c = pIVar11->Width;
        pIVar11 = ImVector<ImGuiTabBarSortItem>::operator[](this,local_94);
        local_10c = local_10c - pIVar11->Width;
      }
      else {
        pIVar11 = ImVector<ImGuiTabBarSortItem>::operator[](this,0);
        local_10c = pIVar11->Width - 1.0;
      }
      fVar13 = ImMin<float>(local_90 / (float)local_94,local_10c);
      for (local_a0 = 0; local_a0 < local_94; local_a0 = local_a0 + 1) {
        pIVar11 = ImVector<ImGuiTabBarSortItem>::operator[](this,local_a0);
        pIVar11->Width = pIVar11->Width - fVar13;
      }
      local_90 = -fVar13 * (float)local_94 + local_90;
    }
    in_stack_fffffffffffffeff = 0;
    for (local_a4 = 0; local_a4 < in_RDI->Size; local_a4 = local_a4 + 1) {
      pIVar11 = ImVector<ImGuiTabBarSortItem>::operator[](this,local_a4);
      fVar13 = pIVar11->Width;
      pIVar11 = ImVector<ImGuiTabBarSortItem>::operator[](this,local_a4);
      pIVar9 = ImVector<ImGuiTabItem>::operator[](in_RDI,pIVar11->Index);
      pIVar9->Width = (float)(int)fVar13;
    }
  }
  local_bc = 0.0;
  for (local_c0 = 0; local_c0 < in_RDI->Size; local_c0 = local_c0 + 1) {
    pIVar9 = ImVector<ImGuiTabItem>::operator[](in_RDI,local_c0);
    pIVar9->Offset = local_bc;
    if ((local_24 == 0) && (tab_bar_00->NavJustMovedToId == pIVar9->ID)) {
      local_24 = pIVar9->ID;
    }
    local_bc = pIVar9->Width + (tab_bar_00->Style).ItemInnerSpacing.x + local_bc;
  }
  fVar13 = ImMax<float>(local_bc - (tab_bar_00->Style).ItemInnerSpacing.x,0.0);
  *(float *)((long)&in_RDI[3].Data + 4) = fVar13;
  in_RDI[4].Size = 0;
  fVar13 = *(float *)((long)&in_RDI[3].Data + 4);
  fVar14 = ImRect::GetWidth((ImRect *)&in_RDI[2].Data);
  bVar12 = false;
  if (((fVar14 < fVar13) && (bVar12 = false, 1 < in_RDI->Size)) &&
     (bVar12 = false, ((ulong)in_RDI[4].Data & 0x1000000000) == 0)) {
    bVar12 = ((ulong)in_RDI[4].Data & 0x8000000000) != 0;
  }
  if ((bVar12) &&
     (pIVar9 = TabBarScrollingButtons((ImGuiTabBar *)tab_bar_00), pIVar9 != (ImGuiTabItem *)0x0)) {
    local_24 = pIVar9->ID;
    in_RDI[1].Capacity = local_24;
  }
  if (!bVar1) {
    in_RDI[1].Capacity = 0;
  }
  if (((in_RDI[1].Capacity == 0) && (*(int *)&in_RDI[1].Data == 0)) &&
     (local_78 != (ImGuiTabItem *)0x0)) {
    local_24 = local_78->ID;
    in_RDI[1].Capacity = local_24;
  }
  *(int *)((long)&in_RDI[1].Data + 4) = in_RDI[1].Capacity;
  *(undefined1 *)((long)&in_RDI[5].Data + 1) = 0;
  if ((local_24 != 0) &&
     (pIVar9 = TabBarFindTabByID((ImGuiTabBar *)
                                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),0),
     pIVar9 != (ImGuiTabItem *)0x0)) {
    TabBarScrollToTab((ImGuiTabBar *)CONCAT44(in_stack_ffffffffffffff04,fVar15),
                      (ImGuiTabItem *)
                      CONCAT17(in_stack_fffffffffffffeff,
                               CONCAT16(in_stack_fffffffffffffefe,
                                        CONCAT24(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8
                                                ))));
  }
  fVar15 = TabBarScrollClamp((ImGuiTabBar *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             in_stack_fffffffffffffecc);
  in_RDI[4].Capacity = (int)fVar15;
  fVar15 = TabBarScrollClamp((ImGuiTabBar *)
                             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             in_stack_fffffffffffffecc);
  *(float *)&in_RDI[4].Data = fVar15;
  if (((float)in_RDI[4].Capacity != *(float *)&in_RDI[4].Data) ||
     (NAN((float)in_RDI[4].Capacity) || NAN(*(float *)&in_RDI[4].Data))) {
    fVar15 = ImLinearSweep(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                           in_stack_fffffffffffffec8);
    in_RDI[4].Capacity = (int)fVar15;
  }
  return;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect
    int tab_dst_n = 0;
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible)
        {
            if (tab->ID == tab_bar->SelectedTabId)
                tab_bar->SelectedTabId = 0;
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId))
        {
            //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
            int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
            if (tab2_order >= 0 && tab2_order < tab_bar->Tabs.Size)
            {
                ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
                ImGuiTabItem item_tmp = *tab1;
                *tab1 = *tab2;
                *tab2 = item_tmp;
                if (tab2->ID == tab_bar->SelectedTabId)
                    scroll_track_selected_tab_id = tab2->ID;
                tab1 = tab2 = NULL;
            }
            if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
                MarkIniSettingsDirty();
        }
        tab_bar->ReorderRequestTabId = 0;
    }

    ImVector<ImGuiTabBarSortItem>& width_sort_buffer = g.TabSortByWidthBuffer;
    width_sort_buffer.resize(tab_bar->Tabs.Size);

    // Compute ideal widths
    float width_total_contents = 0.0f;
    ImGuiTabItem* most_recently_selected_tab = NULL;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if (most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected)
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;

        // Refresh tab width immediately if we can (for manual tab bar, WidthContent will lag by one frame which is mostly noticeable when changing style.FramePadding.x)
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet, 
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        width_total_contents += (tab_n > 0 ? g.Style.ItemInnerSpacing.x : 0.0f) + tab->WidthContents;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        width_sort_buffer[tab_n].Index = tab_n;
        width_sort_buffer[tab_n].Width = tab->WidthContents;
    }

    // Compute width
    const float width_avail = tab_bar->BarRect.GetWidth();
    float width_excess = (width_avail < width_total_contents) ? (width_total_contents - width_avail) : 0.0f;
    if (width_excess > 0.0f && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown))
    {
        // If we don't have enough room, resize down the largest tabs first
        if (tab_bar->Tabs.Size > 1)
            ImQsort(width_sort_buffer.Data, (size_t)width_sort_buffer.Size, sizeof(ImGuiTabBarSortItem), TabBarSortItemComparer);
        int tab_count_same_width = 1;
        while (width_excess > 0.0f && tab_count_same_width < tab_bar->Tabs.Size)
        {
            while (tab_count_same_width < tab_bar->Tabs.Size && width_sort_buffer[0].Width == width_sort_buffer[tab_count_same_width].Width)
                tab_count_same_width++;
            float width_to_remove_per_tab_max = (tab_count_same_width < tab_bar->Tabs.Size) ? (width_sort_buffer[0].Width - width_sort_buffer[tab_count_same_width].Width) : (width_sort_buffer[0].Width - 1.0f);
            float width_to_remove_per_tab = ImMin(width_excess / tab_count_same_width, width_to_remove_per_tab_max);
            for (int tab_n = 0; tab_n < tab_count_same_width; tab_n++)
                width_sort_buffer[tab_n].Width -= width_to_remove_per_tab;
            width_excess -= width_to_remove_per_tab * tab_count_same_width;
        }
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
            tab_bar->Tabs[width_sort_buffer[tab_n].Index].Width = (float)(int)width_sort_buffer[tab_n].Width;
    }
    else
    {
        const float tab_max_width = TabBarCalcMaxTabWidth();
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            tab->Width = ImMin(tab->WidthContents, tab_max_width);
        }
    }

    // Layout all active tabs
    float offset_x = 0.0f;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        tab->Offset = offset_x;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;
        offset_x += tab->Width + g.Style.ItemInnerSpacing.x;
    }
    tab_bar->OffsetMax = ImMax(offset_x - g.Style.ItemInnerSpacing.x, 0.0f);
    tab_bar->OffsetNextTab = 0.0f;

    // Horizontal scrolling buttons
    const bool scrolling_buttons = (tab_bar->OffsetMax > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll);
    if (scrolling_buttons)
        if (ImGuiTabItem* tab_to_select = TabBarScrollingButtons(tab_bar)) // NB: Will alter BarRect.Max.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    const float scrolling_speed = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) ? FLT_MAX : (g.IO.DeltaTime * g.FontSize * 70.0f);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
        tab_bar->ScrollingAnim = ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, scrolling_speed);
}